

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Array<capnp::word>_>::setCapacity
          (Vector<kj::Array<capnp::word>_> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::Array<capnp::word>_> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x18)) {
    ArrayBuilder<kj::Array<capnp::word>_>::truncate(&this->builder,(char *)newSize,lVar1 % 0x18);
  }
  newBuilder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::Array<capnp::word>>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::Array<capnp::word>>::addAll<kj::ArrayBuilder<kj::Array<capnp::word>>>
            ((ArrayBuilder<kj::Array<capnp::word>> *)&newBuilder,&this->builder);
  ArrayBuilder<kj::Array<capnp::word>_>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<kj::Array<capnp::word>_>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }